

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::OpenRulesFileStream(cmGlobalNinjaGenerator *this)

{
  pointer pcVar1;
  char *pcVar2;
  Encoding encoding;
  string *psVar3;
  cmGeneratedFileStream *pcVar4;
  size_t sVar5;
  string rulesFilePath;
  string local_38;
  
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + psVar3->_M_string_length);
  std::__cxx11::string::append((char *)&local_38);
  std::__cxx11::string::append((char *)&local_38);
  pcVar4 = this->RulesFileStream;
  if (pcVar4 == (cmGeneratedFileStream *)0x0) {
    pcVar4 = (cmGeneratedFileStream *)operator_new(0x248);
    encoding = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator[5])(this);
    cmGeneratedFileStream::cmGeneratedFileStream(pcVar4,&local_38,false,encoding);
    this->RulesFileStream = pcVar4;
  }
  WriteDisclaimer(this,(ostream *)pcVar4);
  pcVar4 = this->RulesFileStream;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar4,"# This file contains all the rules used to get the outputs files\n",
             0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar4,"# built from the input files.\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar4,"# It is included in the main \'",0x1e);
  pcVar2 = NINJA_BUILD_FILE;
  if (NINJA_BUILD_FILE == (char *)0x0) {
    std::ios::clear((int)pcVar4 +
                    (int)(pcVar4->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>
                         ._vptr_basic_ostream[-3]);
  }
  else {
    sVar5 = strlen(NINJA_BUILD_FILE);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar4,pcVar2,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar4,"\'.\n\n",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::OpenRulesFileStream()
{
  // Compute Ninja's build file path.
  std::string rulesFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  rulesFilePath += "/";
  rulesFilePath += cmGlobalNinjaGenerator::NINJA_RULES_FILE;

  // Get a stream where to generate things.
  if (!this->RulesFileStream) {
    this->RulesFileStream = new cmGeneratedFileStream(
      rulesFilePath, false, this->GetMakefileEncoding());
    if (!this->RulesFileStream) {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return;
    }
  }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->RulesFileStream);

  // Write comment about this file.
  /* clang-format off */
  *this->RulesFileStream
    << "# This file contains all the rules used to get the outputs files\n"
    << "# built from the input files.\n"
    << "# It is included in the main '" << NINJA_BUILD_FILE << "'.\n\n"
    ;
  /* clang-format on */
}